

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  vfloat<4> vVar3;
  ushort uVar4;
  ushort uVar5;
  BVH *bvh;
  size_t sVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  size_t sVar24;
  byte bVar25;
  byte bVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  size_t sVar30;
  long lVar31;
  float *pfVar32;
  NodeRef root;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  byte bVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  NodeRef *pNVar40;
  uint i_1;
  undefined4 uVar41;
  uint uVar42;
  uint uVar43;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar44;
  bool bVar45;
  byte bVar46;
  ulong uVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar76;
  float fVar82;
  float fVar83;
  vint4 ai_2;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar84;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 bi;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  vint4 bi_1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 in_ZMM2 [64];
  vint4 bi_3;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [12];
  float fVar102;
  vint4 ai;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  uint uVar108;
  uint uVar112;
  uint uVar113;
  vint4 bi_2;
  undefined1 auVar109 [16];
  uint uVar114;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  vint4 ai_1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  vint4 ai_3;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  uint local_1ba4;
  uint local_1b94;
  uint local_1b88;
  Precalculations pre;
  undefined1 local_1b68 [8];
  float fStack_1b60;
  float fStack_1b5c;
  undefined1 local_1b58 [8];
  float fStack_1b50;
  float fStack_1b4c;
  vfloat<4> lower_z;
  vfloat<4> lower_y;
  vfloat<4> upper_z;
  vfloat<4> upper_x;
  vfloat<4> t;
  vfloat<4> v;
  undefined1 local_1928 [16];
  vfloat<4> upper_y;
  TravRayK<4,_false> tray;
  vfloat<4> lower_x;
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  undefined1 local_16f8 [16];
  undefined1 local_16e8 [16];
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar49 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar53 = ZEXT816(0) << 0x40;
    uVar15 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar53,5);
    uVar47 = vpcmpeqd_avx512vl(auVar49,(undefined1  [16])valid_i->field_0);
    uVar47 = ((byte)uVar15 & 0xf) & uVar47;
    bVar46 = (byte)uVar47;
    if (bVar46 != 0) {
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar136 = ZEXT1664(auVar49);
      auVar50 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar49);
      auVar52._8_4_ = 0x219392ef;
      auVar52._0_8_ = 0x219392ef219392ef;
      auVar52._12_4_ = 0x219392ef;
      uVar29 = vcmpps_avx512vl(auVar50,auVar52,1);
      bVar45 = (bool)((byte)uVar29 & 1);
      auVar50._0_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * tray.dir.field_0._0_4_;
      bVar45 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * tray.dir.field_0._4_4_;
      bVar45 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * tray.dir.field_0._8_4_;
      bVar45 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * tray.dir.field_0._12_4_;
      auVar51 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar49);
      uVar29 = vcmpps_avx512vl(auVar51,auVar52,1);
      bVar45 = (bool)((byte)uVar29 & 1);
      auVar51._0_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * tray.dir.field_0._16_4_;
      bVar45 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * tray.dir.field_0._20_4_;
      bVar45 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * tray.dir.field_0._24_4_;
      bVar45 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar51._12_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * tray.dir.field_0._28_4_;
      auVar49 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar49);
      uVar29 = vcmpps_avx512vl(auVar49,auVar52,1);
      bVar45 = (bool)((byte)uVar29 & 1);
      auVar72._0_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * tray.dir.field_0._32_4_;
      bVar45 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar72._4_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * tray.dir.field_0._36_4_;
      bVar45 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar72._8_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * tray.dir.field_0._40_4_;
      bVar45 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar72._12_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * tray.dir.field_0._44_4_;
      auVar52 = vrcp14ps_avx512vl(auVar50);
      auVar54._8_4_ = 0x3f800000;
      auVar54._0_8_ = 0x3f8000003f800000;
      auVar54._12_4_ = 0x3f800000;
      auVar49 = vfnmadd213ps_fma(auVar50,auVar52,auVar54);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar49,auVar52,auVar52)
      ;
      auVar50 = vrcp14ps_avx512vl(auVar51);
      auVar49 = vfnmadd213ps_fma(auVar51,auVar50,auVar54);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar49,auVar50,auVar50)
      ;
      auVar50 = vrcp14ps_avx512vl(auVar72);
      auVar49 = vfnmadd213ps_fma(auVar72,auVar50,auVar54);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar49,auVar50,auVar50)
      ;
      uVar29 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar53,1);
      auVar49 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar49._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar29 & 1) * auVar49._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar49._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar49._12_4_;
      uVar29 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar53,5);
      auVar49 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar45 = (bool)((byte)uVar29 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar45 * auVar49._0_4_ | (uint)!bVar45 * 0x30;
      bVar45 = (bool)((byte)(uVar29 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar45 * auVar49._4_4_ | (uint)!bVar45 * 0x30;
      bVar45 = (bool)((byte)(uVar29 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar45 * auVar49._8_4_ | (uint)!bVar45 * 0x30;
      bVar45 = (bool)((byte)(uVar29 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar45 * auVar49._12_4_ | (uint)!bVar45 * 0x30;
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      uVar29 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar53,5);
      auVar49 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar45 = (bool)((byte)uVar29 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar45 * auVar49._0_4_ | (uint)!bVar45 * 0x50;
      bVar45 = (bool)((byte)(uVar29 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar45 * auVar49._4_4_ | (uint)!bVar45 * 0x50;
      bVar45 = (bool)((byte)(uVar29 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar45 * auVar49._8_4_ | (uint)!bVar45 * 0x50;
      bVar45 = (bool)((byte)(uVar29 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar45 * auVar49._12_4_ | (uint)!bVar45 * 0x50;
      tray.org_rdir.field_0._0_4_ = *(float *)ray * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = *(float *)(ray + 4) * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = *(float *)(ray + 8) * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = *(float *)(ray + 0xc) * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar138 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar49 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar53);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar46 & 1) * auVar49._0_4_ |
           (uint)!(bool)(bVar46 & 1) * stack_near[0].field_0._0_4_;
      bVar45 = (bool)((byte)(uVar47 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar45 * auVar49._4_4_ | (uint)!bVar45 * stack_near[0].field_0._4_4_;
      bVar45 = (bool)((byte)(uVar47 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar45 * auVar49._8_4_ | (uint)!bVar45 * stack_near[0].field_0._8_4_;
      bVar45 = SUB81(uVar47 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar45 * auVar49._12_4_ | (uint)!bVar45 * stack_near[0].field_0._12_4_;
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar137 = ZEXT1664(auVar49);
      auVar53 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar53);
      tray.tfar.field_0.i[0] =
           (uint)(bVar46 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar46 & 1) * auVar49._0_4_;
      bVar45 = (bool)((byte)(uVar47 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar45 * auVar53._4_4_ | (uint)!bVar45 * auVar49._4_4_;
      bVar45 = (bool)((byte)(uVar47 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar45 * auVar53._8_4_ | (uint)!bVar45 * auVar49._8_4_;
      bVar45 = SUB81(uVar47 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar45 * auVar53._12_4_ | (uint)!bVar45 * auVar49._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar34 = 3;
      }
      else {
        uVar34 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      local_1ba4 = (ushort)uVar47 ^ 0xf;
      pNVar40 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar44 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar139 = ZEXT1664(auVar49);
      auVar49 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
      auVar140 = ZEXT1664(auVar49);
LAB_01ca68a8:
      do {
        auVar49 = auVar137._0_16_;
        do {
          root.ptr = pNVar40[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01ca7c9c;
          pNVar40 = pNVar40 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar44[-1].v;
          auVar124 = ZEXT1664((undefined1  [16])vVar3.field_0);
          paVar44 = paVar44 + -1;
          uVar47 = vcmpps_avx512vl((undefined1  [16])vVar3.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar47 == '\0');
        uVar41 = (undefined4)uVar47;
        if (uVar34 < (uint)POPCOUNT(uVar41)) {
LAB_01ca68f0:
          do {
            sVar30 = 8;
            auVar49 = auVar137._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01ca7c9c;
              uVar15 = vcmpps_avx512vl(auVar124._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar15 != '\0') {
                uVar47 = root.ptr & 0xfffffffffffffff0;
                bVar36 = ~(byte)local_1ba4 & 0xf;
                for (lVar28 = 0; auVar49 = auVar137._0_16_,
                    lVar28 != (ulong)((uint)root.ptr & 0xf) - 8; lVar28 = lVar28 + 1) {
                  lVar37 = lVar28 * 0x58;
                  auVar60._8_8_ = 0;
                  auVar60._0_8_ = *(ulong *)(uVar47 + 0x20 + lVar37);
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = *(ulong *)(uVar47 + 0x24 + lVar37);
                  uVar29 = vpcmpub_avx512vl(auVar60,auVar61,2);
                  if ((uVar29 & 0xf) != 0) {
                    lVar37 = lVar37 + uVar47;
                    uVar29 = (ulong)((byte)uVar29 & 0xf);
                    do {
                      lVar17 = 0;
                      for (uVar33 = uVar29; (uVar33 & 1) == 0;
                          uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                        lVar17 = lVar17 + 1;
                      }
                      auVar68._8_8_ = 0;
                      auVar68._0_8_ = *(ulong *)(lVar37 + 0x20);
                      auVar49 = vpmovzxbd_avx(auVar68);
                      auVar49 = vcvtdq2ps_avx(auVar49);
                      uVar41 = *(undefined4 *)(lVar37 + 0x44);
                      auVar85._4_4_ = uVar41;
                      auVar85._0_4_ = uVar41;
                      auVar85._8_4_ = uVar41;
                      auVar85._12_4_ = uVar41;
                      uVar41 = *(undefined4 *)(lVar37 + 0x38);
                      auVar93._4_4_ = uVar41;
                      auVar93._0_4_ = uVar41;
                      auVar93._8_4_ = uVar41;
                      auVar93._12_4_ = uVar41;
                      lower_x.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vfmadd213ps_fma(auVar49,auVar85,auVar93);
                      auVar69._8_8_ = 0;
                      auVar69._0_8_ = *(ulong *)(lVar37 + 0x24);
                      auVar49 = vpmovzxbd_avx(auVar69);
                      auVar49 = vcvtdq2ps_avx(auVar49);
                      upper_x.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vfmadd213ps_fma(auVar49,auVar85,auVar93);
                      auVar73._8_8_ = 0;
                      auVar73._0_8_ = *(ulong *)(lVar37 + 0x28);
                      auVar49 = vpmovzxbd_avx(auVar73);
                      auVar49 = vcvtdq2ps_avx(auVar49);
                      uVar41 = *(undefined4 *)(lVar37 + 0x48);
                      auVar86._4_4_ = uVar41;
                      auVar86._0_4_ = uVar41;
                      auVar86._8_4_ = uVar41;
                      auVar86._12_4_ = uVar41;
                      uVar41 = *(undefined4 *)(lVar37 + 0x3c);
                      auVar94._4_4_ = uVar41;
                      auVar94._0_4_ = uVar41;
                      auVar94._8_4_ = uVar41;
                      auVar94._12_4_ = uVar41;
                      lower_y.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vfmadd213ps_fma(auVar49,auVar86,auVar94);
                      auVar77._8_8_ = 0;
                      auVar77._0_8_ = *(ulong *)(lVar37 + 0x2c);
                      auVar49 = vpmovzxbd_avx(auVar77);
                      auVar49 = vcvtdq2ps_avx(auVar49);
                      upper_y.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vfmadd213ps_fma(auVar49,auVar86,auVar94);
                      auVar74._8_8_ = 0;
                      auVar74._0_8_ = *(ulong *)(lVar37 + 0x30);
                      auVar49 = vpmovzxbd_avx(auVar74);
                      auVar49 = vcvtdq2ps_avx(auVar49);
                      uVar41 = *(undefined4 *)(lVar37 + 0x4c);
                      auVar87._4_4_ = uVar41;
                      auVar87._0_4_ = uVar41;
                      auVar87._8_4_ = uVar41;
                      auVar87._12_4_ = uVar41;
                      uVar41 = *(undefined4 *)(lVar37 + 0x40);
                      auVar95._4_4_ = uVar41;
                      auVar95._0_4_ = uVar41;
                      auVar95._8_4_ = uVar41;
                      auVar95._12_4_ = uVar41;
                      lower_z.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vfmadd213ps_fma(auVar49,auVar87,auVar95);
                      auVar78._8_8_ = 0;
                      auVar78._0_8_ = *(ulong *)(lVar37 + 0x34);
                      auVar49 = vpmovzxbd_avx(auVar78);
                      auVar49 = vcvtdq2ps_avx(auVar49);
                      upper_z.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vfmadd213ps_fma(auVar49,auVar87,auVar95);
                      auVar66._4_4_ = tray.org_rdir.field_0._4_4_;
                      auVar66._0_4_ = tray.org_rdir.field_0._0_4_;
                      auVar66._8_4_ = tray.org_rdir.field_0._8_4_;
                      auVar66._12_4_ = tray.org_rdir.field_0._12_4_;
                      uVar33 = (ulong)(uint)((int)lVar17 * 4);
                      uVar41 = *(undefined4 *)((long)&lower_x.field_0 + uVar33);
                      auVar103._4_4_ = uVar41;
                      auVar103._0_4_ = uVar41;
                      auVar103._8_4_ = uVar41;
                      auVar103._12_4_ = uVar41;
                      auVar50 = vfmsub132ps_fma(auVar103,auVar66,
                                                (undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0);
                      uVar41 = *(undefined4 *)((long)&lower_y.field_0 + uVar33);
                      auVar115._4_4_ = uVar41;
                      auVar115._0_4_ = uVar41;
                      auVar115._8_4_ = uVar41;
                      auVar115._12_4_ = uVar41;
                      auVar67._4_4_ = tray.org_rdir.field_0._36_4_;
                      auVar67._0_4_ = tray.org_rdir.field_0._32_4_;
                      auVar67._8_4_ = tray.org_rdir.field_0._40_4_;
                      auVar67._12_4_ = tray.org_rdir.field_0._44_4_;
                      uVar41 = *(undefined4 *)((long)&lower_z.field_0 + uVar33);
                      auVar118._4_4_ = uVar41;
                      auVar118._0_4_ = uVar41;
                      auVar118._8_4_ = uVar41;
                      auVar118._12_4_ = uVar41;
                      auVar51 = vfmsub132ps_fma(auVar115,(undefined1  [16])
                                                         tray.org_rdir.field_0.field_0.y.field_0,
                                                (undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0);
                      auVar72 = vfmsub132ps_fma(auVar118,auVar67,
                                                (undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0);
                      uVar41 = *(undefined4 *)((long)&upper_x.field_0 + uVar33);
                      auVar62._4_4_ = uVar41;
                      auVar62._0_4_ = uVar41;
                      auVar62._8_4_ = uVar41;
                      auVar62._12_4_ = uVar41;
                      auVar52 = vfmsub132ps_avx512vl
                                          ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,
                                           auVar66,auVar62);
                      uVar41 = *(undefined4 *)((long)&upper_y.field_0 + uVar33);
                      auVar64._4_4_ = uVar41;
                      auVar64._0_4_ = uVar41;
                      auVar64._8_4_ = uVar41;
                      auVar64._12_4_ = uVar41;
                      auVar54 = vfmsub132ps_avx512vl
                                          ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                           (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0
                                           ,auVar64);
                      uVar41 = *(undefined4 *)((long)&upper_z.field_0 + uVar33);
                      auVar65._4_4_ = uVar41;
                      auVar65._0_4_ = uVar41;
                      auVar65._8_4_ = uVar41;
                      auVar65._12_4_ = uVar41;
                      auVar55 = vfmsub132ps_avx512vl
                                          ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,
                                           auVar67,auVar65);
                      auVar49 = vpminsd_avx(auVar50,auVar52);
                      auVar53 = vpminsd_avx(auVar51,auVar54);
                      auVar49 = vpmaxsd_avx(auVar49,auVar53);
                      auVar53 = vpminsd_avx(auVar72,auVar55);
                      auVar49 = vpmaxsd_avx(auVar49,auVar53);
                      auVar53 = vpmaxsd_avx(auVar50,auVar52);
                      auVar50 = vpmaxsd_avx(auVar51,auVar54);
                      auVar50 = vpminsd_avx(auVar53,auVar50);
                      auVar53 = vpmaxsd_avx(auVar72,auVar55);
                      auVar53 = vpminsd_avx(auVar50,auVar53);
                      auVar49 = vpmaxsd_avx(auVar49,(undefined1  [16])tray.tnear.field_0);
                      auVar53 = vpminsd_avx(auVar53,(undefined1  [16])tray.tfar.field_0);
                      uVar15 = vpcmpd_avx512vl(auVar49,auVar53,2);
                      if ((bVar36 & (byte)uVar15 & 0xf) == 0) {
                        bVar45 = false;
                      }
                      else {
                        uVar4 = *(ushort *)(lVar37 + lVar17 * 8);
                        uVar5 = *(ushort *)(lVar37 + 2 + lVar17 * 8);
                        pGVar7 = (context->scene->geometries).items[*(uint *)(lVar37 + 0x50)].ptr;
                        lVar8 = *(long *)&pGVar7->field_0x58;
                        lVar31 = (ulong)*(uint *)(lVar37 + 4 + lVar17 * 8) *
                                 pGVar7[1].super_RefCount.refCounter.
                                 super___atomic_base<unsigned_long>._M_i;
                        lVar9 = *(long *)&pGVar7[1].time_range.upper;
                        uVar42 = uVar4 & 0x7fff;
                        uVar43 = uVar5 & 0x7fff;
                        uVar108 = *(uint *)(lVar8 + 4 + lVar31);
                        uVar33 = (ulong)uVar108;
                        uVar38 = (ulong)(uVar108 * uVar43 + *(int *)(lVar8 + lVar31) + uVar42);
                        p_Var10 = pGVar7[1].intersectionFilterN;
                        lVar17 = uVar38 + uVar33;
                        lVar39 = uVar38 + uVar33 + 1;
                        local_17a8 = *(undefined1 (*) [16])(lVar9 + lVar17 * (long)p_Var10);
                        local_1768 = *(undefined1 (*) [16])(lVar9 + lVar39 * (long)p_Var10);
                        auVar49 = vpbroadcastd_avx512vl();
                        auVar124 = ZEXT1664(auVar49);
                        uVar48 = (ulong)(-1 < (short)uVar4);
                        lVar35 = uVar48 + lVar39;
                        local_1778 = *(undefined1 (*) [16])(lVar9 + lVar35 * (long)p_Var10);
                        if ((short)uVar5 < 0) {
                          uVar33 = 0;
                        }
                        local_1738 = *(undefined1 (*) [16])
                                      (lVar9 + (lVar39 + uVar33) * (long)p_Var10);
                        lower_x.field_0 =
                             *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                              (lVar9 + (long)p_Var10 * uVar38);
                        local_1798 = *(undefined1 (*) [16])(lVar9 + (uVar38 + 1) * (long)p_Var10);
                        local_1788 = *(undefined1 (*) [16])
                                      (lVar9 + (uVar38 + uVar48 + 1) * (long)p_Var10);
                        local_1758 = local_17a8;
                        local_1748 = local_1768;
                        local_1728 = *(undefined1 (*) [16])
                                      (lVar9 + (lVar17 + uVar33) * (long)p_Var10);
                        local_1718 = local_1768;
                        local_1708 = local_1778;
                        local_16f8 = *(undefined1 (*) [16])
                                      (lVar9 + (uVar33 + lVar35) * (long)p_Var10);
                        local_16e8 = local_1738;
                        auVar49 = vpbroadcastd_avx512vl();
                        auVar141 = ZEXT1664(auVar49);
                        pfVar32 = (float *)(local_17a8 + 8);
                        uVar33 = 0;
                        bVar26 = bVar36;
                        do {
                          auVar49 = auVar140._0_16_;
                          if (uVar33 == 4) goto LAB_01ca7b1f;
                          fVar75 = pfVar32[-0xe];
                          auVar88._4_4_ = fVar75;
                          auVar88._0_4_ = fVar75;
                          auVar88._8_4_ = fVar75;
                          auVar88._12_4_ = fVar75;
                          fVar82 = pfVar32[-0xd];
                          auVar109._4_4_ = fVar82;
                          auVar109._0_4_ = fVar82;
                          auVar109._8_4_ = fVar82;
                          auVar109._12_4_ = fVar82;
                          fVar83 = pfVar32[-0xc];
                          auVar121._4_4_ = fVar83;
                          auVar121._0_4_ = fVar83;
                          auVar121._8_4_ = fVar83;
                          auVar121._12_4_ = fVar83;
                          fVar84 = pfVar32[-10];
                          local_1b68._4_4_ = pfVar32[-9];
                          local_1b58._4_4_ = pfVar32[-8];
                          auVar57 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar32[-6]));
                          auVar58 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar32[-5]));
                          auVar59 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar32[-4]));
                          fVar102 = pfVar32[-2];
                          fVar2 = pfVar32[-1];
                          fVar120 = *pfVar32;
                          local_1928 = vmovdqa64_avx512vl(auVar141._0_16_);
                          vmovdqa64_avx512vl(auVar124._0_16_);
                          fVar14 = fVar75 - fVar84;
                          auVar125._4_4_ = fVar14;
                          auVar125._0_4_ = fVar14;
                          auVar125._8_4_ = fVar14;
                          auVar125._12_4_ = fVar14;
                          local_1b68._0_4_ = local_1b68._4_4_;
                          fStack_1b60 = (float)local_1b68._4_4_;
                          fStack_1b5c = (float)local_1b68._4_4_;
                          fVar128 = fVar82 - (float)local_1b68._4_4_;
                          auVar127._4_4_ = fVar128;
                          auVar127._0_4_ = fVar128;
                          auVar127._8_4_ = fVar128;
                          auVar127._12_4_ = fVar128;
                          local_1b58._0_4_ = local_1b58._4_4_;
                          fStack_1b50 = (float)local_1b58._4_4_;
                          fStack_1b4c = (float)local_1b58._4_4_;
                          fVar76 = fVar83 - (float)local_1b58._4_4_;
                          auVar131._4_4_ = fVar76;
                          auVar131._0_4_ = fVar76;
                          auVar131._8_4_ = fVar76;
                          auVar131._12_4_ = fVar76;
                          auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar102 - fVar75)));
                          auVar61 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 - fVar82)));
                          auVar62 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar120 - fVar83)));
                          fVar128 = fVar128 * (fVar120 - fVar83);
                          auVar116._4_4_ = fVar128;
                          auVar116._0_4_ = fVar128;
                          auVar116._8_4_ = fVar128;
                          auVar116._12_4_ = fVar128;
                          aVar63 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                   vfmsub231ps_avx512vl(auVar116,auVar61,auVar131);
                          fVar76 = fVar76 * (fVar102 - fVar75);
                          auVar117._4_4_ = fVar76;
                          auVar117._0_4_ = fVar76;
                          auVar117._8_4_ = fVar76;
                          auVar117._12_4_ = fVar76;
                          auVar64 = vfmsub231ps_avx512vl(auVar117,auVar62,auVar125);
                          fVar14 = (fVar2 - fVar82) * fVar14;
                          auVar119._4_4_ = fVar14;
                          auVar119._0_4_ = fVar14;
                          auVar119._8_4_ = fVar14;
                          auVar119._12_4_ = fVar14;
                          auVar53 = *(undefined1 (*) [16])ray;
                          auVar50 = *(undefined1 (*) [16])(ray + 0x10);
                          auVar51 = *(undefined1 (*) [16])(ray + 0x20);
                          auVar72 = *(undefined1 (*) [16])(ray + 0x40);
                          auVar65 = vfmsub231ps_avx512vl(auVar119,auVar60,auVar127);
                          auVar55 = vsubps_avx(auVar88,auVar53);
                          auVar70 = vsubps_avx(auVar109,auVar50);
                          auVar71 = vsubps_avx(auVar121,auVar51);
                          auVar52 = *(undefined1 (*) [16])(ray + 0x50);
                          auVar54 = *(undefined1 (*) [16])(ray + 0x60);
                          auVar66 = vmulps_avx512vl(auVar52,auVar71);
                          auVar66 = vfmsub231ps_avx512vl(auVar66,auVar70,auVar54);
                          auVar67 = vmulps_avx512vl(auVar54,auVar55);
                          auVar67 = vfmsub231ps_avx512vl(auVar67,auVar71,auVar72);
                          auVar68 = vmulps_avx512vl(auVar72,auVar70);
                          auVar68 = vfmsub231ps_avx512vl(auVar68,auVar55,auVar52);
                          auVar69 = vmulps_avx512vl(auVar62,auVar68);
                          auVar61 = vfmadd231ps_avx512vl(auVar69,auVar67,auVar61);
                          auVar69 = vmulps_avx512vl(auVar65,auVar54);
                          auVar69 = vfmadd231ps_avx512vl(auVar69,auVar64,auVar52);
                          auVar69 = vfmadd231ps_avx512vl(auVar69,(undefined1  [16])aVar63,auVar72);
                          auVar60 = vfmadd231ps_avx512vl(auVar61,auVar66,auVar60);
                          auVar61 = vandps_avx512vl(auVar69,auVar139._0_16_);
                          auVar60 = vxorps_avx512vl(auVar61,auVar60);
                          uVar15 = vcmpps_avx512vl(auVar60,auVar49,5);
                          bVar25 = (byte)uVar15 & bVar26;
                          if (bVar25 != 0) {
                            auVar73 = vmulps_avx512vl(auVar131,auVar68);
                            auVar67 = vfmadd213ps_avx512vl(auVar67,auVar127,auVar73);
                            auVar66 = vfmadd213ps_avx512vl(auVar66,auVar125,auVar67);
                            auVar73 = vxorps_avx512vl(auVar61,auVar66);
                            uVar15 = vcmpps_avx512vl(auVar73,auVar49,5);
                            bVar25 = bVar25 & (byte)uVar15;
                            if (bVar25 != 0) {
                              auVar78 = auVar136._0_16_;
                              auVar74 = vandps_avx512vl(auVar69,auVar78);
                              auVar77 = vsubps_avx(auVar74,auVar60);
                              uVar15 = vcmpps_avx512vl(auVar77,auVar73,5);
                              bVar25 = bVar25 & (byte)uVar15;
                              if (bVar25 != 0) {
                                auVar77 = vmovdqa64_avx512vl(auVar141._0_16_);
                                auVar85 = vmovdqa64_avx512vl(auVar124._0_16_);
                                auVar66 = vxorps_avx512vl(auVar66,auVar66);
                                auVar133._0_4_ = auVar65._0_4_ * auVar71._0_4_;
                                auVar133._4_4_ = auVar65._4_4_ * auVar71._4_4_;
                                auVar133._8_4_ = auVar65._8_4_ * auVar71._8_4_;
                                auVar133._12_4_ = auVar65._12_4_ * auVar71._12_4_;
                                auVar70 = vfmadd213ps_fma(auVar70,auVar64,auVar133);
                                auVar55 = vfmadd213ps_fma(auVar55,(undefined1  [16])aVar63,auVar70);
                                fVar75 = auVar74._0_4_;
                                auVar129._0_4_ = fVar75 * *(float *)(ray + 0x30);
                                fVar82 = auVar74._4_4_;
                                auVar129._4_4_ = fVar82 * *(float *)(ray + 0x34);
                                fVar83 = auVar74._8_4_;
                                auVar129._8_4_ = fVar83 * *(float *)(ray + 0x38);
                                fVar128 = auVar74._12_4_;
                                auVar129._12_4_ = fVar128 * *(float *)(ray + 0x3c);
                                auVar55 = vxorps_avx512vl(auVar61,auVar55);
                                auVar134._0_4_ = fVar75 * *(float *)(ray + 0x80);
                                auVar134._4_4_ = fVar82 * *(float *)(ray + 0x84);
                                auVar134._8_4_ = fVar83 * *(float *)(ray + 0x88);
                                auVar134._12_4_ = fVar128 * *(float *)(ray + 0x8c);
                                uVar15 = vcmpps_avx512vl(auVar55,auVar134,2);
                                uVar16 = vcmpps_avx512vl(auVar129,auVar55,1);
                                bVar25 = bVar25 & (byte)uVar15 & (byte)uVar16;
                                if (bVar25 != 0) {
                                  uVar15 = vcmpps_avx512vl(auVar69,auVar66,4);
                                  bVar25 = bVar25 & (byte)uVar15;
                                  if (bVar25 != 0) {
                                    pGVar7 = (context->scene->geometries).items
                                             [*(uint *)(local_1928 + uVar33 * 4)].ptr;
                                    uVar108 = pGVar7->mask;
                                    auVar130._4_4_ = uVar108;
                                    auVar130._0_4_ = uVar108;
                                    auVar130._8_4_ = uVar108;
                                    auVar130._12_4_ = uVar108;
                                    uVar15 = vptestmd_avx512vl(auVar130,*(undefined1 (*) [16])
                                                                         (ray + 0x90));
                                    bVar25 = (byte)uVar15 & 0xf & bVar25;
                                    local_1b94 = (uint)bVar25;
                                    if (bVar25 != 0) {
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar53 = vcvtsi2ss_avx512f(auVar78,*(ushort *)
                                                                             (lVar8 + 8 + lVar31) -
                                                                            1);
                                        auVar51 = ZEXT816(0) << 0x20;
                                        auVar101 = SUB1612(ZEXT816(0),0);
                                        auVar90._4_12_ = auVar101;
                                        auVar90._0_4_ = auVar53._0_4_;
                                        auVar50 = vrcp14ss_avx512f(auVar51,auVar90);
                                        auVar53 = vfnmadd213ss_fma(auVar53,auVar50,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar76 = auVar50._0_4_ * auVar53._0_4_;
                                        auVar53 = vcvtsi2ss_avx512f(auVar78,*(ushort *)
                                                                             (lVar8 + 10 + lVar31) -
                                                                            1);
                                        auVar97._4_12_ = auVar101;
                                        auVar97._0_4_ = auVar53._0_4_;
                                        auVar50 = vrcp14ss_avx512f(auVar51,auVar97);
                                        auVar53 = vfnmadd213ss_fma(auVar53,auVar50,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar14 = auVar50._0_4_ * auVar53._0_4_;
                                        auVar53 = vcvtsi2ss_avx512f(auVar78,((uint)uVar33 & 1) +
                                                                            uVar42);
                                        fVar92 = auVar53._0_4_;
                                        auVar98._0_4_ = auVar60._0_4_ + fVar75 * fVar92;
                                        auVar98._4_4_ = auVar60._4_4_ + fVar82 * fVar92;
                                        auVar98._8_4_ = auVar60._8_4_ + fVar83 * fVar92;
                                        auVar98._12_4_ = auVar60._12_4_ + fVar128 * fVar92;
                                        auVar80._4_4_ = fVar76;
                                        auVar80._0_4_ = fVar76;
                                        auVar80._8_4_ = fVar76;
                                        auVar80._12_4_ = fVar76;
                                        vmulps_avx512vl(auVar98,auVar80);
                                        auVar53 = vcvtsi2ss_avx512f(auVar78,((uint)(uVar33 >> 1) &
                                                                            0x7fffffff) + uVar43);
                                        fVar76 = auVar53._0_4_;
                                        auVar81._0_4_ = auVar73._0_4_ + fVar75 * fVar76;
                                        auVar81._4_4_ = auVar73._4_4_ + fVar82 * fVar76;
                                        auVar81._8_4_ = auVar73._8_4_ + fVar83 * fVar76;
                                        auVar81._12_4_ = auVar73._12_4_ + fVar128 * fVar76;
                                        auVar91._4_4_ = fVar14;
                                        auVar91._0_4_ = fVar14;
                                        auVar91._8_4_ = fVar14;
                                        auVar91._12_4_ = fVar14;
                                        vmulps_avx512vl(auVar81,auVar91);
                                        auVar53 = vrcp14ps_avx512vl(auVar74);
                                        auVar19._8_4_ = 0x3f800000;
                                        auVar19._0_8_ = 0x3f8000003f800000;
                                        auVar19._12_4_ = 0x3f800000;
                                        auVar50 = vfnmadd213ps_avx512vl(auVar74,auVar53,auVar19);
                                        vfmadd132ps_fma(auVar50,auVar53,auVar53);
                                        lower_y.field_0._8_8_ = &t;
                                        lower_y.field_0._0_8_ = &upper_y;
                                        upper_x.field_0 = aVar63;
                                        std::
                                        _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                                        ::
                                        _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                                  ((
                                                  _Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                                  *)&lower_y,
                                                  (
                                                  _Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                  *)&upper_x);
                                        auVar53 = vpbroadcastd_avx512vl();
                                        vpbroadcastd_avx512vl();
                                        upper_x = upper_y;
                                        vpcmpeqd_avx2(ZEXT1632(auVar53),ZEXT1632(auVar53));
                                        auVar53 = *(undefined1 (*) [16])(ray + 0x80);
                                        auVar50 = vblendmps_avx512vl(auVar53,(undefined1  [16])
                                                                             t.field_0);
                                        bVar45 = (bool)(bVar25 >> 1 & 1);
                                        bVar12 = (bool)(bVar25 >> 2 & 1);
                                        *(uint *)(ray + 0x80) =
                                             (uint)(bVar25 & 1) * auVar50._0_4_ |
                                             (uint)!(bool)(bVar25 & 1) * auVar53._0_4_;
                                        *(uint *)(ray + 0x84) =
                                             (uint)bVar45 * auVar50._4_4_ |
                                             (uint)!bVar45 * auVar53._4_4_;
                                        *(uint *)(ray + 0x88) =
                                             (uint)bVar12 * auVar50._8_4_ |
                                             (uint)!bVar12 * auVar53._8_4_;
                                        *(uint *)(ray + 0x8c) =
                                             (uint)(bVar25 >> 3) * auVar50._12_4_ |
                                             (uint)!(bool)(bVar25 >> 3) * auVar53._12_4_;
                                        lower_z.field_0 =
                                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                             vpmovm2d_avx512vl((ulong)local_1b94);
                                        lower_y.field_0._8_8_ = pGVar7->userPtr;
                                        lower_y.field_0._0_8_ = &lower_z;
                                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          (*pGVar7->occlusionFilterN)
                                                    ((RTCFilterFunctionNArguments *)&lower_y);
                                        }
                                        uVar48 = vptestmd_avx512vl((undefined1  [16])lower_z.field_0
                                                                   ,(undefined1  [16])
                                                                    lower_z.field_0);
                                        if ((uVar48 & 0xf) == 0) {
                                          local_1b94 = 0;
                                        }
                                        else {
                                          p_Var10 = context->args->filter;
                                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                            (*p_Var10)((RTCFilterFunctionNArguments *)&lower_y);
                                          }
                                          uVar48 = vptestmd_avx512vl((undefined1  [16])
                                                                     lower_z.field_0,
                                                                     (undefined1  [16])
                                                                     lower_z.field_0);
                                          uVar48 = uVar48 & 0xf;
                                          auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar45 = (bool)((byte)uVar48 & 1);
                                          bVar12 = (bool)((byte)(uVar48 >> 1) & 1);
                                          bVar11 = (bool)((byte)(uVar48 >> 2) & 1);
                                          bVar13 = SUB81(uVar48 >> 3,0);
                                          local_1b94 = (uint)uVar48;
                                          *(uint *)(ray + 0x80) =
                                               (uint)bVar45 * auVar50._0_4_ |
                                               (uint)!bVar45 * *(int *)(ray + 0x80);
                                          *(uint *)(ray + 0x84) =
                                               (uint)bVar12 * auVar50._4_4_ |
                                               (uint)!bVar12 * *(int *)(ray + 0x84);
                                          *(uint *)(ray + 0x88) =
                                               (uint)bVar11 * auVar50._8_4_ |
                                               (uint)!bVar11 * *(int *)(ray + 0x88);
                                          *(uint *)(ray + 0x8c) =
                                               (uint)bVar13 * auVar50._12_4_ |
                                               (uint)!bVar13 * *(int *)(ray + 0x8c);
                                        }
                                        bVar45 = (bool)((byte)local_1b94 & 1);
                                        bVar12 = (bool)((byte)(local_1b94 >> 1) & 1);
                                        bVar11 = (bool)((byte)(local_1b94 >> 2) & 1);
                                        *(uint *)(ray + 0x80) =
                                             (uint)bVar45 * *(int *)(ray + 0x80) |
                                             (uint)!bVar45 * auVar53._0_4_;
                                        *(uint *)(ray + 0x84) =
                                             (uint)bVar12 * *(int *)(ray + 0x84) |
                                             (uint)!bVar12 * auVar53._4_4_;
                                        *(uint *)(ray + 0x88) =
                                             (uint)bVar11 * *(int *)(ray + 0x88) |
                                             (uint)!bVar11 * auVar53._8_4_;
                                        *(uint *)(ray + 0x8c) =
                                             (local_1b94 >> 3) * *(int *)(ray + 0x8c) |
                                             (uint)!SUB41(local_1b94 >> 3,0) * auVar53._12_4_;
                                        auVar53 = *(undefined1 (*) [16])ray;
                                        auVar50 = *(undefined1 (*) [16])(ray + 0x10);
                                        auVar51 = *(undefined1 (*) [16])(ray + 0x20);
                                        auVar72 = *(undefined1 (*) [16])(ray + 0x40);
                                        auVar52 = *(undefined1 (*) [16])(ray + 0x50);
                                        auVar54 = *(undefined1 (*) [16])(ray + 0x60);
                                      }
                                      bVar26 = ((byte)local_1b94 ^ 0xf) & bVar26;
                                    }
                                  }
                                }
                                auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar136 = ZEXT1664(auVar55);
                                auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                auVar137 = ZEXT1664(auVar55);
                                auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar138 = ZEXT1664(auVar55);
                                auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar139 = ZEXT1664(auVar55);
                                auVar49 = vxorps_avx512vl(auVar49,auVar49);
                                auVar140 = ZEXT1664(auVar49);
                                auVar49 = vmovdqa64_avx512vl(auVar85);
                                auVar124 = ZEXT1664(auVar49);
                                auVar49 = vmovdqa64_avx512vl(auVar77);
                                auVar141 = ZEXT1664(auVar49);
                              }
                            }
                          }
                          auVar20._4_4_ = fVar84;
                          auVar20._0_4_ = fVar84;
                          auVar20._8_4_ = fVar84;
                          auVar20._12_4_ = fVar84;
                          auVar21._4_4_ = fVar102;
                          auVar21._0_4_ = fVar102;
                          auVar21._8_4_ = fVar102;
                          auVar21._12_4_ = fVar102;
                          auVar23._4_4_ = fVar2;
                          auVar23._0_4_ = fVar2;
                          auVar23._8_4_ = fVar2;
                          auVar23._12_4_ = fVar2;
                          auVar22._4_4_ = fVar120;
                          auVar22._0_4_ = fVar120;
                          auVar22._8_4_ = fVar120;
                          auVar22._12_4_ = fVar120;
                          auVar55 = vsubps_avx512vl(auVar57,auVar21);
                          auVar70 = vsubps_avx512vl(auVar58,auVar23);
                          auVar71 = vsubps_avx512vl(auVar59,auVar22);
                          auVar60 = vsubps_avx512vl(auVar20,auVar57);
                          auVar61 = vsubps_avx512vl(_local_1b68,auVar58);
                          auVar64 = vsubps_avx512vl(_local_1b58,auVar59);
                          auVar49 = vmulps_avx512vl(auVar70,auVar64);
                          aVar63 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                   vfmsub231ps_avx512vl(auVar49,auVar61,auVar71);
                          auVar49 = vmulps_avx512vl(auVar71,auVar60);
                          auVar65 = vfmsub231ps_avx512vl(auVar49,auVar64,auVar55);
                          auVar49 = vmulps_avx512vl(auVar55,auVar61);
                          auVar66 = vfmsub231ps_avx512vl(auVar49,auVar60,auVar70);
                          auVar57 = vsubps_avx512vl(auVar57,auVar53);
                          auVar58 = vsubps_avx512vl(auVar58,auVar50);
                          auVar59 = vsubps_avx512vl(auVar59,auVar51);
                          auVar99._0_4_ = auVar59._0_4_ * auVar52._0_4_;
                          auVar99._4_4_ = auVar59._4_4_ * auVar52._4_4_;
                          auVar99._8_4_ = auVar59._8_4_ * auVar52._8_4_;
                          auVar99._12_4_ = auVar59._12_4_ * auVar52._12_4_;
                          auVar53 = vfmsub231ps_fma(auVar99,auVar58,auVar54);
                          auVar132._0_4_ = auVar54._0_4_ * auVar57._0_4_;
                          auVar132._4_4_ = auVar54._4_4_ * auVar57._4_4_;
                          auVar132._8_4_ = auVar54._8_4_ * auVar57._8_4_;
                          auVar132._12_4_ = auVar54._12_4_ * auVar57._12_4_;
                          auVar50 = vfmsub231ps_fma(auVar132,auVar59,auVar72);
                          auVar135._0_4_ = auVar58._0_4_ * auVar72._0_4_;
                          auVar135._4_4_ = auVar58._4_4_ * auVar72._4_4_;
                          auVar135._8_4_ = auVar58._8_4_ * auVar72._8_4_;
                          auVar135._12_4_ = auVar58._12_4_ * auVar72._12_4_;
                          auVar51 = vfmsub231ps_fma(auVar135,auVar57,auVar52);
                          auVar104._0_4_ = auVar66._0_4_ * auVar54._0_4_;
                          auVar104._4_4_ = auVar66._4_4_ * auVar54._4_4_;
                          auVar104._8_4_ = auVar66._8_4_ * auVar54._8_4_;
                          auVar104._12_4_ = auVar66._12_4_ * auVar54._12_4_;
                          auVar49 = vfmadd231ps_fma(auVar104,auVar65,auVar52);
                          auVar49 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar63,auVar72);
                          auVar72 = vandps_avx512vl(auVar49,auVar139._0_16_);
                          auVar52 = vmulps_avx512vl(auVar64,auVar51);
                          auVar52 = vfmadd231ps_avx512vl(auVar52,auVar50,auVar61);
                          auVar52 = vfmadd231ps_avx512vl(auVar52,auVar53,auVar60);
                          uVar108 = auVar72._0_4_;
                          auVar89._0_4_ = uVar108 ^ auVar52._0_4_;
                          uVar112 = auVar72._4_4_;
                          auVar89._4_4_ = uVar112 ^ auVar52._4_4_;
                          uVar113 = auVar72._8_4_;
                          auVar89._8_4_ = uVar113 ^ auVar52._8_4_;
                          uVar114 = auVar72._12_4_;
                          auVar89._12_4_ = uVar114 ^ auVar52._12_4_;
                          auVar72 = auVar140._0_16_;
                          uVar15 = vcmpps_avx512vl(auVar89,auVar72,5);
                          local_1b88._0_1_ = (byte)uVar15 & bVar26;
                          if ((byte)local_1b88 != 0) {
                            auVar79._0_4_ = auVar71._0_4_ * auVar51._0_4_;
                            auVar79._4_4_ = auVar71._4_4_ * auVar51._4_4_;
                            auVar79._8_4_ = auVar71._8_4_ * auVar51._8_4_;
                            auVar79._12_4_ = auVar71._12_4_ * auVar51._12_4_;
                            auVar50 = vfmadd213ps_fma(auVar50,auVar70,auVar79);
                            auVar53 = vfmadd213ps_fma(auVar53,auVar55,auVar50);
                            auVar100._0_4_ = uVar108 ^ auVar53._0_4_;
                            auVar100._4_4_ = uVar112 ^ auVar53._4_4_;
                            auVar100._8_4_ = uVar113 ^ auVar53._8_4_;
                            auVar100._12_4_ = uVar114 ^ auVar53._12_4_;
                            uVar15 = vcmpps_avx512vl(auVar100,auVar72,5);
                            local_1b88._0_1_ = (byte)local_1b88 & (byte)uVar15;
                            if ((byte)local_1b88 != 0) {
                              auVar50 = vandps_avx512vl(auVar49,auVar136._0_16_);
                              auVar53 = vsubps_avx(auVar50,auVar89);
                              uVar15 = vcmpps_avx512vl(auVar53,auVar100,5);
                              local_1b88._0_1_ = (byte)local_1b88 & (byte)uVar15;
                              if ((byte)local_1b88 != 0) {
                                auVar51 = vmovdqa64_avx512vl(auVar141._0_16_);
                                auVar52 = vmovdqa64_avx512vl(auVar124._0_16_);
                                auVar126._0_4_ = auVar66._0_4_ * auVar59._0_4_;
                                auVar126._4_4_ = auVar66._4_4_ * auVar59._4_4_;
                                auVar126._8_4_ = auVar66._8_4_ * auVar59._8_4_;
                                auVar126._12_4_ = auVar66._12_4_ * auVar59._12_4_;
                                auVar54 = vfmadd213ps_fma(auVar58,auVar65,auVar126);
                                auVar54 = vfmadd213ps_fma(auVar57,(undefined1  [16])aVar63,auVar54);
                                fVar75 = auVar50._0_4_;
                                auVar122._0_4_ = fVar75 * *(float *)(ray + 0x30);
                                fVar82 = auVar50._4_4_;
                                auVar122._4_4_ = fVar82 * *(float *)(ray + 0x34);
                                fVar83 = auVar50._8_4_;
                                auVar122._8_4_ = fVar83 * *(float *)(ray + 0x38);
                                fVar84 = auVar50._12_4_;
                                auVar122._12_4_ = fVar84 * *(float *)(ray + 0x3c);
                                auVar96._0_4_ = uVar108 ^ auVar54._0_4_;
                                auVar96._4_4_ = uVar112 ^ auVar54._4_4_;
                                auVar96._8_4_ = uVar113 ^ auVar54._8_4_;
                                auVar96._12_4_ = uVar114 ^ auVar54._12_4_;
                                auVar110._0_4_ = fVar75 * *(float *)(ray + 0x80);
                                auVar110._4_4_ = fVar82 * *(float *)(ray + 0x84);
                                auVar110._8_4_ = fVar83 * *(float *)(ray + 0x88);
                                auVar110._12_4_ = fVar84 * *(float *)(ray + 0x8c);
                                uVar15 = vcmpps_avx512vl(auVar96,auVar110,2);
                                uVar16 = vcmpps_avx512vl(auVar122,auVar96,1);
                                local_1b88._0_1_ = (byte)local_1b88 & (byte)uVar15 & (byte)uVar16;
                                if ((byte)local_1b88 != 0) {
                                  uVar15 = vcmpps_avx512vl(auVar49,ZEXT816(0) << 0x20,4);
                                  local_1b88._0_1_ = (byte)local_1b88 & (byte)uVar15;
                                  if ((byte)local_1b88 != 0) {
                                    pGVar7 = (context->scene->geometries).items
                                             [*(uint *)(local_1928 + uVar33 * 4)].ptr;
                                    uVar108 = pGVar7->mask;
                                    auVar105._4_4_ = uVar108;
                                    auVar105._0_4_ = uVar108;
                                    auVar105._8_4_ = uVar108;
                                    auVar105._12_4_ = uVar108;
                                    uVar15 = vptestmd_avx512vl(auVar105,*(undefined1 (*) [16])
                                                                         (ray + 0x90));
                                    local_1b88._0_1_ = (byte)uVar15 & 0xf & (byte)local_1b88;
                                    if ((byte)local_1b88 != 0) {
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar49 = vsubps_avx(auVar50,auVar100);
                                        auVar54 = vcvtsi2ss_avx512f(auVar62,*(ushort *)
                                                                             (lVar8 + 8 + lVar31) -
                                                                            1);
                                        auVar55 = vrcp14ss_avx512f(ZEXT416(0) << 0x20,
                                                                   ZEXT416(auVar54._0_4_));
                                        auVar54 = vfnmadd213ss_fma(auVar54,auVar55,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar102 = auVar55._0_4_ * auVar54._0_4_;
                                        auVar54 = vcvtsi2ss_avx512f(auVar62,*(ushort *)
                                                                             (lVar8 + 10 + lVar31) -
                                                                            1);
                                        auVar55 = vrcp14ss_avx512f(ZEXT416(0) << 0x20,
                                                                   ZEXT416(auVar54._0_4_));
                                        auVar54 = vfnmadd213ss_fma(auVar54,auVar55,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar2 = auVar55._0_4_ * auVar54._0_4_;
                                        auVar54 = vcvtsi2ss_avx512f(auVar68,((uint)uVar33 & 1) +
                                                                            uVar42);
                                        fVar120 = auVar54._0_4_;
                                        auVar123._0_4_ = fVar120 * fVar75 + auVar53._0_4_;
                                        auVar123._4_4_ = fVar120 * fVar82 + auVar53._4_4_;
                                        auVar123._8_4_ = fVar120 * fVar83 + auVar53._8_4_;
                                        auVar123._12_4_ = fVar120 * fVar84 + auVar53._12_4_;
                                        auVar106._4_4_ = fVar102;
                                        auVar106._0_4_ = fVar102;
                                        auVar106._8_4_ = fVar102;
                                        auVar106._12_4_ = fVar102;
                                        vmulps_avx512vl(auVar123,auVar106);
                                        auVar53 = vcvtsi2ss_avx512f(auVar67,((uint)(uVar33 >> 1) &
                                                                            0x7fffffff) + uVar43);
                                        fVar102 = auVar53._0_4_;
                                        auVar107._0_4_ = auVar49._0_4_ + fVar102 * fVar75;
                                        auVar107._4_4_ = auVar49._4_4_ + fVar102 * fVar82;
                                        auVar107._8_4_ = auVar49._8_4_ + fVar102 * fVar83;
                                        auVar107._12_4_ = auVar49._12_4_ + fVar102 * fVar84;
                                        auVar111._4_4_ = fVar2;
                                        auVar111._0_4_ = fVar2;
                                        auVar111._8_4_ = fVar2;
                                        auVar111._12_4_ = fVar2;
                                        vmulps_avx512vl(auVar107,auVar111);
                                        auVar49 = vrcp14ps_avx512vl(auVar50);
                                        auVar18._8_4_ = 0x3f800000;
                                        auVar18._0_8_ = 0x3f8000003f800000;
                                        auVar18._12_4_ = 0x3f800000;
                                        auVar53 = vfnmadd213ps_avx512vl(auVar50,auVar49,auVar18);
                                        vfmadd132ps_fma(auVar53,auVar49,auVar49);
                                        lower_y.field_0._8_8_ = &t;
                                        lower_y.field_0._0_8_ = &upper_y;
                                        upper_x.field_0 = aVar63;
                                        std::
                                        _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                                        ::
                                        _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                                  ((
                                                  _Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                                  *)&lower_y,
                                                  (
                                                  _Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                  *)&upper_x);
                                        auVar49 = vpbroadcastd_avx512vl();
                                        vpbroadcastd_avx512vl();
                                        upper_x = upper_y;
                                        vpcmpeqd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar49));
                                        auVar49 = *(undefined1 (*) [16])(ray + 0x80);
                                        auVar53 = vblendmps_avx512vl(auVar49,(undefined1  [16])
                                                                             t.field_0);
                                        bVar45 = (bool)((byte)local_1b88 >> 1 & 1);
                                        bVar12 = (bool)((byte)local_1b88 >> 2 & 1);
                                        *(uint *)(ray + 0x80) =
                                             (uint)((byte)local_1b88 & 1) * auVar53._0_4_ |
                                             (uint)!(bool)((byte)local_1b88 & 1) * auVar49._0_4_;
                                        *(uint *)(ray + 0x84) =
                                             (uint)bVar45 * auVar53._4_4_ |
                                             (uint)!bVar45 * auVar49._4_4_;
                                        *(uint *)(ray + 0x88) =
                                             (uint)bVar12 * auVar53._8_4_ |
                                             (uint)!bVar12 * auVar49._8_4_;
                                        *(uint *)(ray + 0x8c) =
                                             (uint)((byte)local_1b88 >> 3) * auVar53._12_4_ |
                                             (uint)!(bool)((byte)local_1b88 >> 3) * auVar49._12_4_;
                                        lower_z.field_0 =
                                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                             vpmovm2d_avx512vl((ulong)(byte)local_1b88);
                                        lower_y.field_0._8_8_ = pGVar7->userPtr;
                                        lower_y.field_0._0_8_ = &lower_z;
                                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          (*pGVar7->occlusionFilterN)
                                                    ((RTCFilterFunctionNArguments *)&lower_y);
                                        }
                                        uVar48 = vptestmd_avx512vl((undefined1  [16])lower_z.field_0
                                                                   ,(undefined1  [16])
                                                                    lower_z.field_0);
                                        if ((uVar48 & 0xf) == 0) {
                                          local_1b88 = 0;
                                        }
                                        else {
                                          p_Var10 = context->args->filter;
                                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                            (*p_Var10)((RTCFilterFunctionNArguments *)&lower_y);
                                          }
                                          uVar48 = vptestmd_avx512vl((undefined1  [16])
                                                                     lower_z.field_0,
                                                                     (undefined1  [16])
                                                                     lower_z.field_0);
                                          uVar48 = uVar48 & 0xf;
                                          auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar45 = (bool)((byte)uVar48 & 1);
                                          bVar12 = (bool)((byte)(uVar48 >> 1) & 1);
                                          bVar11 = (bool)((byte)(uVar48 >> 2) & 1);
                                          bVar13 = SUB81(uVar48 >> 3,0);
                                          local_1b88 = (uint)uVar48;
                                          *(uint *)(ray + 0x80) =
                                               (uint)bVar45 * auVar53._0_4_ |
                                               (uint)!bVar45 * *(int *)(ray + 0x80);
                                          *(uint *)(ray + 0x84) =
                                               (uint)bVar12 * auVar53._4_4_ |
                                               (uint)!bVar12 * *(int *)(ray + 0x84);
                                          *(uint *)(ray + 0x88) =
                                               (uint)bVar11 * auVar53._8_4_ |
                                               (uint)!bVar11 * *(int *)(ray + 0x88);
                                          *(uint *)(ray + 0x8c) =
                                               (uint)bVar13 * auVar53._12_4_ |
                                               (uint)!bVar13 * *(int *)(ray + 0x8c);
                                        }
                                        bVar45 = (bool)((byte)(local_1b88 >> 1) & 1);
                                        bVar12 = (bool)((byte)(local_1b88 >> 2) & 1);
                                        *(uint *)pRVar1 =
                                             (uint)((byte)local_1b88 & 1) * *(int *)pRVar1 |
                                             (uint)!(bool)((byte)local_1b88 & 1) * auVar49._0_4_;
                                        *(uint *)(ray + 0x84) =
                                             (uint)bVar45 * *(int *)(ray + 0x84) |
                                             (uint)!bVar45 * auVar49._4_4_;
                                        *(uint *)(ray + 0x88) =
                                             (uint)bVar12 * *(int *)(ray + 0x88) |
                                             (uint)!bVar12 * auVar49._8_4_;
                                        *(uint *)(ray + 0x8c) =
                                             (local_1b88 >> 3) * *(int *)(ray + 0x8c) |
                                             (uint)!SUB41(local_1b88 >> 3,0) * auVar49._12_4_;
                                      }
                                      bVar26 = ((byte)local_1b88 ^ 0xf) & bVar26;
                                    }
                                  }
                                }
                                auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar136 = ZEXT1664(auVar49);
                                auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                auVar137 = ZEXT1664(auVar49);
                                auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar138 = ZEXT1664(auVar49);
                                auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar139 = ZEXT1664(auVar49);
                                auVar49 = vxorps_avx512vl(auVar72,auVar72);
                                auVar140 = ZEXT1664(auVar49);
                                auVar49 = vmovdqa64_avx512vl(auVar52);
                                auVar124 = ZEXT1664(auVar49);
                                auVar49 = vmovdqa64_avx512vl(auVar51);
                                auVar141 = ZEXT1664(auVar49);
                              }
                            }
                          }
                          uVar33 = uVar33 + 1;
                          pfVar32 = pfVar32 + 0x10;
                        } while (bVar26 != 0);
                        bVar26 = 0;
LAB_01ca7b1f:
                        bVar36 = bVar36 & bVar26;
                        bVar45 = bVar36 == 0;
                      }
                    } while ((!bVar45) && (uVar29 = uVar29 - 1 & uVar29, uVar29 != 0));
                  }
                }
                bVar36 = (byte)local_1ba4 | ~bVar36 & 0xf;
                local_1ba4 = (uint)bVar36;
                if (bVar36 == 0xf) {
                  local_1ba4._0_1_ = 0xf;
                  goto LAB_01ca7c9c;
                }
                auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar45 = (bool)(bVar36 >> 1 & 1);
                bVar12 = (bool)(bVar36 >> 2 & 1);
                bVar11 = (bool)(bVar36 >> 3 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar45 * auVar49._4_4_ | (uint)!bVar45 * tray.tfar.field_0.i[1];
                tray.tfar.field_0.i[0] =
                     (uint)(bVar36 & 1) * auVar49._0_4_ |
                     (uint)!(bool)(bVar36 & 1) * tray.tfar.field_0.i[0];
                tray.tfar.field_0.i[2] =
                     (uint)bVar12 * auVar49._8_4_ | (uint)!bVar12 * tray.tfar.field_0.i[2];
                tray.tfar.field_0.i[3] =
                     (uint)bVar11 * auVar49._12_4_ | (uint)!bVar11 * tray.tfar.field_0.i[3];
              }
              goto LAB_01ca68a8;
            }
            aVar63 = auVar138._0_16_;
            for (lVar28 = 0;
                (auVar124 = ZEXT1664((undefined1  [16])aVar63), lVar28 != 4 &&
                (sVar6 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar28 * 8), sVar6 != 8));
                lVar28 = lVar28 + 1) {
              auVar70._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar70._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar70._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar70._12_4_ = tray.org_rdir.field_0._12_4_;
              uVar41 = *(undefined4 *)(root.ptr + 0x20 + lVar28 * 4);
              auVar57._4_4_ = uVar41;
              auVar57._0_4_ = uVar41;
              auVar57._8_4_ = uVar41;
              auVar57._12_4_ = uVar41;
              auVar50 = vfmsub132ps_fma(auVar57,auVar70,
                                        (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
              uVar41 = *(undefined4 *)(root.ptr + 0x40 + lVar28 * 4);
              auVar58._4_4_ = uVar41;
              auVar58._0_4_ = uVar41;
              auVar58._8_4_ = uVar41;
              auVar58._12_4_ = uVar41;
              auVar71._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar71._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar71._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar71._12_4_ = tray.org_rdir.field_0._44_4_;
              uVar41 = *(undefined4 *)(root.ptr + 0x60 + lVar28 * 4);
              auVar59._4_4_ = uVar41;
              auVar59._0_4_ = uVar41;
              auVar59._8_4_ = uVar41;
              auVar59._12_4_ = uVar41;
              auVar51 = vfmsub132ps_fma(auVar58,(undefined1  [16])
                                                tray.org_rdir.field_0.field_0.y.field_0,
                                        (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
              auVar72 = vfmsub132ps_fma(auVar59,auVar71,
                                        (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
              uVar41 = *(undefined4 *)(root.ptr + 0x30 + lVar28 * 4);
              auVar49._4_4_ = uVar41;
              auVar49._0_4_ = uVar41;
              auVar49._8_4_ = uVar41;
              auVar49._12_4_ = uVar41;
              auVar52 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar70,
                                   auVar49);
              uVar41 = *(undefined4 *)(root.ptr + 0x50 + lVar28 * 4);
              auVar53._4_4_ = uVar41;
              auVar53._0_4_ = uVar41;
              auVar53._8_4_ = uVar41;
              auVar53._12_4_ = uVar41;
              auVar54 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                   (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0,auVar53
                                  );
              uVar41 = *(undefined4 *)(root.ptr + 0x70 + lVar28 * 4);
              auVar55._4_4_ = uVar41;
              auVar55._0_4_ = uVar41;
              auVar55._8_4_ = uVar41;
              auVar55._12_4_ = uVar41;
              auVar55 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar71,
                                   auVar55);
              auVar49 = vpminsd_avx(auVar50,auVar52);
              auVar53 = vpminsd_avx(auVar51,auVar54);
              auVar49 = vpmaxsd_avx(auVar49,auVar53);
              auVar53 = vpminsd_avx(auVar72,auVar55);
              auVar49 = vpmaxsd_avx(auVar49,auVar53);
              auVar53 = vpmaxsd_avx(auVar50,auVar52);
              auVar50 = vpmaxsd_avx(auVar51,auVar54);
              auVar50 = vpminsd_avx(auVar53,auVar50);
              auVar53 = vpmaxsd_avx(auVar72,auVar55);
              auVar50 = vpminsd_avx(auVar50,auVar53);
              auVar53 = vpmaxsd_avx(auVar49,(undefined1  [16])tray.tnear.field_0);
              auVar50 = vpminsd_avx(auVar50,(undefined1  [16])tray.tfar.field_0);
              uVar47 = vpcmpd_avx512vl(auVar53,auVar50,2);
              uVar47 = uVar47 & 0xf;
              sVar24 = sVar30;
              aVar56 = aVar63;
              if ((byte)uVar47 != 0) {
                auVar53 = vblendmps_avx512vl((undefined1  [16])auVar138._0_16_,auVar49);
                bVar45 = (bool)((byte)uVar47 & 1);
                aVar56._0_4_ = (uint)bVar45 * auVar53._0_4_ | (uint)!bVar45 * auVar49._0_4_;
                bVar45 = (bool)((byte)(uVar47 >> 1) & 1);
                aVar56._4_4_ = (uint)bVar45 * auVar53._4_4_ | (uint)!bVar45 * auVar49._4_4_;
                bVar45 = (bool)((byte)(uVar47 >> 2) & 1);
                aVar56._8_4_ = (uint)bVar45 * auVar53._8_4_ | (uint)!bVar45 * auVar49._8_4_;
                bVar45 = SUB81(uVar47 >> 3,0);
                aVar56._12_4_ = (uint)bVar45 * auVar53._12_4_ | (uint)!bVar45 * auVar49._12_4_;
                sVar24 = sVar6;
                if (sVar30 != 8) {
                  pNVar40->ptr = sVar30;
                  pNVar40 = pNVar40 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar44->v = aVar63;
                  paVar44 = paVar44 + 1;
                }
              }
              aVar63 = aVar56;
              sVar30 = sVar24;
            }
            if (sVar30 == 8) goto LAB_01ca6a52;
            uVar15 = vcmpps_avx512vl((undefined1  [16])aVar63,(undefined1  [16])tray.tfar.field_0,9)
            ;
            root.ptr = sVar30;
          } while ((byte)uVar34 < (byte)POPCOUNT((int)uVar15));
          pNVar40->ptr = sVar30;
          pNVar40 = pNVar40 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar44->v = aVar63;
          paVar44 = paVar44 + 1;
LAB_01ca6a52:
          iVar27 = 4;
        }
        else {
          while (uVar47 != 0) {
            sVar30 = 0;
            for (uVar29 = uVar47; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
              sVar30 = sVar30 + 1;
            }
            uVar47 = uVar47 - 1 & uVar47;
            bVar45 = occluded1(This,bvh,root,sVar30,&pre,ray,&tray,context);
            bVar36 = (byte)(1 << ((uint)sVar30 & 0x1f));
            if (!bVar45) {
              bVar36 = 0;
            }
            local_1ba4 = (uint)((byte)local_1ba4 | bVar36);
          }
          iVar27 = 3;
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar136 = ZEXT1664(auVar49);
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar137 = ZEXT1664(auVar49);
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar138 = ZEXT1664(auVar49);
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar139 = ZEXT1664(auVar49);
          auVar49 = vxorps_avx512vl(auVar140._0_16_,auVar140._0_16_);
          auVar140 = ZEXT1664(auVar49);
          auVar124 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if ((byte)local_1ba4 != 0xf) {
            auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_1ba4 & 1) * auVar49._0_4_ |
                 (uint)!(bool)((byte)local_1ba4 & 1) * tray.tfar.field_0.i[0];
            bVar45 = (bool)((byte)(local_1ba4 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar45 * auVar49._4_4_ | (uint)!bVar45 * tray.tfar.field_0.i[1];
            bVar45 = (bool)((byte)(local_1ba4 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar45 * auVar49._8_4_ | (uint)!bVar45 * tray.tfar.field_0.i[2];
            bVar45 = (bool)((byte)(local_1ba4 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar45 * auVar49._12_4_ | (uint)!bVar45 * tray.tfar.field_0.i[3];
            iVar27 = 2;
          }
          if (uVar34 < (uint)POPCOUNT(uVar41)) goto LAB_01ca68f0;
        }
        auVar49 = auVar137._0_16_;
        if (iVar27 == 3) {
LAB_01ca7c9c:
          local_1ba4._0_1_ = (byte)local_1ba4 & bVar46;
          bVar45 = (bool)((byte)local_1ba4 >> 1 & 1);
          bVar12 = (bool)((byte)local_1ba4 >> 2 & 1);
          *(uint *)pRVar1 =
               (uint)((byte)local_1ba4 & 1) * auVar49._0_4_ |
               (uint)!(bool)((byte)local_1ba4 & 1) * *(int *)pRVar1;
          *(uint *)(ray + 0x84) =
               (uint)bVar45 * auVar49._4_4_ | (uint)!bVar45 * *(int *)(ray + 0x84);
          *(uint *)(ray + 0x88) =
               (uint)bVar12 * auVar49._8_4_ | (uint)!bVar12 * *(int *)(ray + 0x88);
          *(uint *)(ray + 0x8c) =
               (uint)((byte)local_1ba4 >> 3) * auVar49._12_4_ |
               (uint)!(bool)((byte)local_1ba4 >> 3) * *(int *)(ray + 0x8c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }